

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,message,"\n");
  (*this->_vptr_AbstractSocketWriter[2])(this,&local_30);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void SendLn(const std::string& message) { Send(message + "\n"); }